

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  testing_base tb;
  
  tb = testing_new(argc,argv,0);
  testing_run_(tb,test_rlock,"test_rlock",0);
  testing_run_(tb,test_mu_nthread,"test_mu_nthread",0);
  testing_run_(tb,test_mutex_nthread,"test_mutex_nthread",0);
  testing_run_(tb,test_rwmutex_nthread,"test_rwmutex_nthread",0);
  testing_run_(tb,test_try_mu_nthread,"test_try_mu_nthread",0);
  testing_run_(tb,benchmark_mu_contended,"benchmark_mu_contended",1);
  testing_run_(tb,benchmark_mutex_contended,"benchmark_mutex_contended",1);
  testing_run_(tb,benchmark_wmutex_contended,"benchmark_wmutex_contended",1);
  testing_run_(tb,benchmark_mu_uncontended,"benchmark_mu_uncontended",1);
  testing_run_(tb,benchmark_rmu_uncontended,"benchmark_rmu_uncontended",1);
  testing_run_(tb,benchmark_mutex_uncontended,"benchmark_mutex_uncontended",1);
  testing_run_(tb,benchmark_wmutex_uncontended,"benchmark_wmutex_uncontended",1);
  testing_run_(tb,benchmark_rmutex_uncontended,"benchmark_rmutex_uncontended",1);
  testing_run_(tb,benchmark_mu_uncontended_waiter,"benchmark_mu_uncontended_waiter",1);
  testing_run_(tb,benchmark_mu_uncontended_no_wakeup,"benchmark_mu_uncontended_no_wakeup",1);
  testing_run_(tb,benchmark_rmu_uncontended_waiter,"benchmark_rmu_uncontended_waiter",1);
  iVar1 = testing_base_exit(tb);
  return iVar1;
}

Assistant:

int main (int argc, char *argv[]) {
	testing_base tb = testing_new (argc, argv, 0);

	TEST_RUN (tb, test_rlock);
	TEST_RUN (tb, test_mu_nthread);
	TEST_RUN (tb, test_mutex_nthread);
	TEST_RUN (tb, test_rwmutex_nthread);
	TEST_RUN (tb, test_try_mu_nthread);

	BENCHMARK_RUN (tb, benchmark_mu_contended);
	BENCHMARK_RUN (tb, benchmark_mutex_contended);
	BENCHMARK_RUN (tb, benchmark_wmutex_contended);

	BENCHMARK_RUN (tb, benchmark_mu_uncontended);
	BENCHMARK_RUN (tb, benchmark_rmu_uncontended);
	BENCHMARK_RUN (tb, benchmark_mutex_uncontended);
	BENCHMARK_RUN (tb, benchmark_wmutex_uncontended);
	BENCHMARK_RUN (tb, benchmark_rmutex_uncontended);
	BENCHMARK_RUN (tb, benchmark_mu_uncontended_waiter);
	BENCHMARK_RUN (tb, benchmark_mu_uncontended_no_wakeup);
	BENCHMARK_RUN (tb, benchmark_rmu_uncontended_waiter);

	return (testing_base_exit (tb));
}